

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O3

void __thiscall
Assimp::MDLImporter::ImportUVCoordinate_3DGS_MDL345
          (MDLImporter *this,aiVector3D *vOut,TexCoord_MDL3 *pcSrc,uint iIndex)

{
  uchar *puVar1;
  Logger *this_00;
  float fVar2;
  float fVar5;
  undefined1 auVar4 [16];
  undefined8 uVar3;
  
  if (pcSrc != (TexCoord_MDL3 *)0x0) {
    puVar1 = this->mBuffer;
    if (*(uint *)(puVar1 + 0x48) <= iIndex) {
      iIndex = *(uint *)(puVar1 + 0x48) - 1;
      this_00 = DefaultLogger::get();
      Logger::warn(this_00,"Index overflow in MDLn UV coord list");
    }
    auVar4 = pshuflw(ZEXT416((uint)pcSrc[iIndex]),ZEXT416((uint)pcSrc[iIndex]),0x60);
    fVar2 = (float)(auVar4._0_4_ >> 0x10);
    fVar5 = (float)(auVar4._4_4_ >> 0x10);
    uVar3 = CONCAT44(fVar5,fVar2);
    if (this->iGSFileVersion != 5) {
      uVar3 = CONCAT44(1.0 - (fVar5 + 0.5) / (float)*(int *)(puVar1 + 0x38),
                       (fVar2 + 0.5) / (float)*(int *)(puVar1 + 0x34));
    }
    vOut->x = (float)(int)uVar3;
    vOut->y = (float)(int)((ulong)uVar3 >> 0x20);
    vOut->z = 0.0;
    return;
  }
  __assert_fail("__null != pcSrc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                ,0x314,
                "void Assimp::MDLImporter::ImportUVCoordinate_3DGS_MDL345(aiVector3D &, const MDL::TexCoord_MDL3 *, unsigned int)"
               );
}

Assistant:

void MDLImporter::ImportUVCoordinate_3DGS_MDL345(
    aiVector3D& vOut,
    const MDL::TexCoord_MDL3* pcSrc,
    unsigned int iIndex)
{
    ai_assert(NULL != pcSrc);
    const MDL::Header* const pcHeader = (const MDL::Header*)this->mBuffer;

    // validate UV indices
    if (iIndex >= (unsigned int) pcHeader->synctype)    {
        iIndex = pcHeader->synctype-1;
        ASSIMP_LOG_WARN("Index overflow in MDLn UV coord list");
    }

    float s = (float)pcSrc[iIndex].u;
    float t = (float)pcSrc[iIndex].v;

    // Scale s and t to range from 0.0 to 1.0
    if (0x5 != iGSFileVersion)  {
        s = (s + 0.5f)      / pcHeader->skinwidth;
        t = 1.0f-(t + 0.5f) / pcHeader->skinheight;
    }

    vOut.x = s;
    vOut.y = t;
    vOut.z = 0.0f;
}